

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteCollectionFetchRecordById(unqlite_col *pCol,jx9_int64 nId,jx9_value *pValue)

{
  uint uVar1;
  sxu32 nByte;
  _func_void_unqlite_kv_cursor_ptr *p_Var2;
  int iVar3;
  unqlite_col_record *puVar4;
  unqlite_kv_cursor *pCursor;
  
  jx9MemObjRelease(pValue);
  if (pCol->nRec != 0) {
    for (puVar4 = pCol->apRecord[(uint)nId & pCol->nRecSize - 1];
        puVar4 != (unqlite_col_record *)0x0; puVar4 = puVar4->pNextCol) {
      if (puVar4->nId == nId) {
        jx9MemObjStore(&puVar4->sValue,pValue);
        return 0;
      }
    }
  }
  (pCol->sWorker).nByte = 0;
  uVar1 = (pCol->sWorker).nFlags;
  if ((uVar1 & 4) != 0) {
    (pCol->sWorker).pBlob = (void *)0x0;
    (pCol->sWorker).mByte = 0;
    (pCol->sWorker).nFlags = uVar1 & 0xfffffffb;
  }
  SyBlobFormat(&pCol->sWorker,"%z_%qd",&pCol->sName,nId);
  pCursor = pCol->pCursor;
  p_Var2 = pCursor->pStore->pIo->pMethods->xReset;
  if (p_Var2 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
    (*p_Var2)(pCursor);
    pCursor = pCol->pCursor;
  }
  iVar3 = unqlite_kv_cursor_seek(pCursor,(pCol->sWorker).pBlob,(pCol->sWorker).nByte,1);
  if (iVar3 == 0) {
    (pCol->sWorker).nByte = 0;
    uVar1 = (pCol->sWorker).nFlags;
    if ((uVar1 & 4) != 0) {
      (pCol->sWorker).pBlob = (void *)0x0;
      (pCol->sWorker).mByte = 0;
      (pCol->sWorker).nFlags = uVar1 & 0xfffffffb;
    }
    (*pCol->pCursor->pStore->pIo->pMethods->xData)(pCol->pCursor,unqliteDataConsumer,&pCol->sWorker)
    ;
    nByte = (pCol->sWorker).nByte;
    if (nByte == 0) {
      iVar3 = 0;
      unqliteGenErrorFormat(pCol->pVm->pDb,"Empty record \'%qd\'",nId);
      jx9MemObjRelease(pValue);
    }
    else {
      iVar3 = FastJsonDecode((pCol->sWorker).pBlob,nByte,pValue,(uchar **)0x0,0);
      if (iVar3 == 0) {
        CollectionCacheInstallRecord(pCol,nId,pValue);
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

UNQLITE_PRIVATE int unqliteCollectionFetchRecordById(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId,     /* Unique record ID */
	jx9_value *pValue  /* OUT: record value */
	)
{
	SyBlob *pWorker = &pCol->sWorker;
	unqlite_col_record *pRec;
	int rc;
	jx9_value_null(pValue);
	/* Perform a cache lookup first */
	pRec = CollectionCacheFetchRecord(pCol,nId);
	if( pRec ){
		/* Copy record value */
		jx9MemObjStore(&pRec->sValue,pValue);
		return UNQLITE_OK;
	}
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	/* Generate the unique ID */
	SyBlobFormat(pWorker,"%z_%qd",&pCol->sName,nId);
	/* Reset the cursor */
	unqlite_kv_cursor_reset(pCol->pCursor);
	/* Seek the cursor to the desired location */
	rc = unqlite_kv_cursor_seek(pCol->pCursor,
		SyBlobData(pWorker),SyBlobLength(pWorker),
		UNQLITE_CURSOR_MATCH_EXACT
		);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Consume the binary JSON */
	SyBlobReset(pWorker);
	unqlite_kv_cursor_data_callback(pCol->pCursor,unqliteDataConsumer,pWorker);
	if( SyBlobLength(pWorker) < 1 ){
		unqliteGenErrorFormat(pCol->pVm->pDb,
			"Empty record '%qd'",nId
			);
		jx9_value_null(pValue);
	}else{
		/* Decode the binary JSON */
		rc = FastJsonDecode(SyBlobData(pWorker),SyBlobLength(pWorker),pValue,0,0);
		if( rc == UNQLITE_OK ){
			/* Install the record in the cache */
			CollectionCacheInstallRecord(pCol,nId,pValue);
		}
	}
	return rc;
}